

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O0

void UpdateTeam(int pnum,int team,bool update)

{
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *this;
  bool bVar1;
  uint uVar2;
  int iVar3;
  FTeam *this_00;
  char *pcVar4;
  char *pcVar5;
  FBaseCVar **ppFVar6;
  FName local_28;
  uint local_24;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *pTStack_20;
  int oldteam;
  userinfo_t *info;
  uint local_10;
  int iStack_c;
  bool update_local;
  int team_local;
  int pnum_local;
  
  pTStack_20 = (TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *)
               ((long)pnum * 0x2a0 + 0x1ae70f8);
  info._7_1_ = update;
  local_10 = team;
  iStack_c = pnum;
  uVar2 = FIntCVar::operator_cast_to_int(&dmflags2);
  if (((uVar2 & 0x10) != 0) &&
     ((bVar1 = FBoolCVar::operator_cast_to_bool(&alwaysapplydmflags), bVar1 ||
      (iVar3 = FIntCVar::operator_cast_to_int(&deathmatch), iVar3 != 0)))) {
    uVar2 = userinfo_t::GetTeam((userinfo_t *)pTStack_20);
    bVar1 = FTeam::IsValidTeam(&TeamLibrary,uVar2);
    if (bVar1) {
      Printf("Team changing has been disabled!\n");
      return;
    }
  }
  bVar1 = FTeam::IsValidTeam(&TeamLibrary,local_10);
  if (!bVar1) {
    local_10 = 0xff;
  }
  local_24 = userinfo_t::GetTeam((userinfo_t *)pTStack_20);
  local_10 = userinfo_t::TeamChanged((userinfo_t *)pTStack_20,local_10);
  if (((info._7_1_ & 1) != 0) && (local_24 != local_10)) {
    bVar1 = FTeam::IsValidTeam(&TeamLibrary,local_10);
    if (bVar1) {
      pcVar5 = userinfo_t::GetName((userinfo_t *)pTStack_20);
      this_00 = TArray<FTeam,_FTeam>::operator[](&Teams,(long)(int)local_10);
      pcVar4 = FTeam::GetName(this_00);
      Printf("%s joined the %s team\n",pcVar5,pcVar4);
    }
    else {
      pcVar5 = userinfo_t::GetName((userinfo_t *)pTStack_20);
      Printf("%s is now a loner\n",pcVar5);
    }
  }
  R_BuildPlayerTranslation(iStack_c);
  if ((StatusBar != (DBaseStatusBar *)0x0) &&
     (iVar3 = DBaseStatusBar::GetPlayer(StatusBar), iVar3 == iStack_c)) {
    (*(StatusBar->super_DObject)._vptr_DObject[10])(StatusBar,&players + (long)iStack_c * 0x54);
  }
  bVar1 = FTeam::IsValidTeam(&TeamLibrary,local_10);
  this = pTStack_20;
  if (!bVar1) {
    FName::FName(&local_28,NAME_Team);
    ppFVar6 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                        (this,&local_28);
    FIntCVar::operator=((FIntCVar *)*ppFVar6,0xff);
  }
  return;
}

Assistant:

static void UpdateTeam (int pnum, int team, bool update)
{
	userinfo_t *info = &players[pnum].userinfo;

	if ((dmflags2 & DF2_NO_TEAM_SWITCH) && (alwaysapplydmflags || deathmatch) && TeamLibrary.IsValidTeam (info->GetTeam()))
	{
		Printf ("Team changing has been disabled!\n");
		return;
	}

	int oldteam;

	if (!TeamLibrary.IsValidTeam (team))
	{
		team = TEAM_NONE;
	}
	oldteam = info->GetTeam();
	team = info->TeamChanged(team);

	if (update && oldteam != team)
	{
		if (TeamLibrary.IsValidTeam (team))
			Printf ("%s joined the %s team\n", info->GetName(), Teams[team].GetName ());
		else
			Printf ("%s is now a loner\n", info->GetName());
	}
	// Let the player take on the team's color
	R_BuildPlayerTranslation (pnum);
	if (StatusBar != NULL && StatusBar->GetPlayer() == pnum)
	{
		StatusBar->AttachToPlayer (&players[pnum]);
	}
	// Double-check
	if (!TeamLibrary.IsValidTeam (team))
	{
		*static_cast<FIntCVar *>((*info)[NAME_Team]) = TEAM_NONE;
	}
}